

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O0

bool crnlib::dxt_fast::determine_selectors
               (uint n,color_quad_u8 *block,uint min16,uint max16,uint8 *pSelectors)

{
  color_quad<unsigned_char,_int> *pcVar1;
  int in_ECX;
  int in_EDX;
  color_quad_u8 *in_RSI;
  uint in_EDI;
  uint8 *in_R8;
  color_quad_u8 color [4];
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  color_quad<unsigned_char,_int> *local_40;
  color_quad<unsigned_char,_int> local_38 [4];
  color_quad_u8 acStack_28 [2];
  uint8 *local_20;
  int local_18;
  int local_14;
  color_quad_u8 *local_10;
  uint local_8;
  bool local_1;
  
  pcVar1 = local_38;
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  do {
    local_40 = pcVar1;
    color_quad<unsigned_char,_int>::color_quad(local_40);
    pcVar1 = local_40 + 1;
  } while (local_40 + 1 != acStack_28);
  if (local_18 == local_14) {
    memset(local_20,0,(ulong)local_8);
    local_1 = false;
  }
  else {
    eval_colors(local_40,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    local_1 = match_block_colors(local_8,local_10,local_38,local_20);
  }
  return local_1;
}

Assistant:

static bool determine_selectors(uint n, const color_quad_u8* block, uint min16, uint max16, uint8* pSelectors) {
  color_quad_u8 color[4];

  if (max16 != min16) {
    eval_colors(color, min16, max16);

    return match_block_colors(n, block, color, pSelectors);
  }

  memset(pSelectors, 0, n);
  return false;
}